

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

WhereBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_wherebroadcastable(NeuralNetworkLayer *this)

{
  bool bVar1;
  WhereBroadcastableLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_wherebroadcastable(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_wherebroadcastable(this);
    this_00 = (WhereBroadcastableLayerParams *)operator_new(0x18);
    WhereBroadcastableLayerParams::WhereBroadcastableLayerParams(this_00);
    (this->layer_).wherebroadcastable_ = this_00;
  }
  return (WhereBroadcastableLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::WhereBroadcastableLayerParams* NeuralNetworkLayer::mutable_wherebroadcastable() {
  if (!has_wherebroadcastable()) {
    clear_layer();
    set_has_wherebroadcastable();
    layer_.wherebroadcastable_ = new ::CoreML::Specification::WhereBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.whereBroadcastable)
  return layer_.wherebroadcastable_;
}